

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O1

size_t __thiscall baryonyx::bit_array_hash::operator()(bit_array_hash *this,bit_array *array)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = (array->super_bit_array_impl).m_block_size;
  if ((ulong)uVar1 == 0) {
    sVar2 = 0;
  }
  else {
    uVar3 = 0;
    sVar2 = 0;
    do {
      if ((~((int)uVar1 >> 0x1f) & uVar1) <= uVar1 - 1) {
        operator()((bit_array_hash *)(ulong)(uVar1 - 1));
      }
      sVar2 = (sVar2 >> 2) + sVar2 * 0x40 +
              (array->super_bit_array_impl).m_data._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar3] + 0x9e3779b9 ^ sVar2
      ;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return sVar2;
}

Assistant:

std::size_t operator()(const bit_array& array) const noexcept
    {
        std::size_t ret{ 0 };

        for (int i = 0, e = array.block_size(); i != e; ++i)
            ret ^=
              std::hash<bit_array_impl::underlying_type>()(array.block(i)) +
              0x9e3779b9 + (ret << 6) + (ret >> 2);

        return ret;
    }